

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateMergeFrom
          (MessageGenerator *this,Printer *printer)

{
  string *value;
  FieldGenerator *pFVar1;
  Descriptor *pDVar2;
  int iVar3;
  ulong uVar4;
  int __c;
  int extraout_EDX;
  int i_00;
  ulong uVar5;
  FieldDescriptor *field;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *this_00;
  char *pcVar6;
  int i;
  long lVar7;
  long lVar8;
  ulong uVar9;
  string local_50;
  
  value = &this->classname_;
  if (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0x88) + 0x50) == 3) {
    io::Printer::Print(printer,
                       "void $classname$::CheckTypeAndMergeFrom(\n    const ::google::protobuf::MessageLite& from) {\n  MergeFrom(*::google::protobuf::down_cast<const $classname$*>(&from));\n}\n\n"
                       ,"classname",value);
  }
  else {
    io::Printer::Print(printer,
                       "void $classname$::MergeFrom(const ::google::protobuf::Message& from) {\n  GOOGLE_CHECK_NE(&from, this);\n"
                       ,"classname",value);
    io::Printer::Indent(printer);
    io::Printer::Print(printer,
                       "const $classname$* source =\n  ::google::protobuf::internal::dynamic_cast_if_available<const $classname$*>(\n    &from);\nif (source == NULL) {\n  ::google::protobuf::internal::ReflectionOps::Merge(from, this);\n} else {\n  MergeFrom(*source);\n}\n"
                       ,"classname",value);
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"}\n\n");
  }
  io::Printer::Print(printer,
                     "void $classname$::MergeFrom(const $classname$& from) {\n  GOOGLE_CHECK_NE(&from, this);\n"
                     ,"classname",value);
  io::Printer::Indent(printer);
  lVar8 = 0;
  lVar7 = 0;
  while( true ) {
    pDVar2 = this->descriptor_;
    uVar5 = (ulong)*(int *)(pDVar2 + 0x2c);
    if ((long)uVar5 <= lVar7) break;
    if (*(int *)(*(long *)(pDVar2 + 0x30) + 0x30 + lVar8) == 3) {
      pFVar1 = FieldGeneratorMap::get
                         (&this->field_generators_,
                          (FieldDescriptor *)(*(long *)(pDVar2 + 0x30) + lVar8));
      (*pFVar1->_vptr_FieldGenerator[7])(pFVar1,printer);
    }
    lVar7 = lVar7 + 1;
    lVar8 = lVar8 + 0x78;
  }
  uVar4 = 0xffffffffffffffff;
  lVar7 = 0;
  uVar9 = 0;
  do {
    iVar3 = (int)uVar4;
    if ((long)(int)uVar5 <= (long)uVar9) {
      if (-1 < iVar3) {
        io::Printer::Outdent(printer);
        io::Printer::Print(printer,"}\n");
        pDVar2 = this->descriptor_;
      }
      if (0 < *(int *)(pDVar2 + 0x58)) {
        io::Printer::Print(printer,"_extensions_.MergeFrom(from._extensions_);\n");
        pDVar2 = this->descriptor_;
      }
      if (*(int *)(*(long *)(*(long *)(pDVar2 + 0x10) + 0x88) + 0x50) != 3) {
        io::Printer::Print(printer,"mutable_unknown_fields()->MergeFrom(from.unknown_fields());\n");
      }
      io::Printer::Outdent(printer);
      io::Printer::Print(printer,"}\n");
      return;
    }
    if (*(int *)(*(long *)(pDVar2 + 0x30) + 0x30 + lVar7) != 3) {
      this_00 = (FieldDescriptor *)(*(long *)(pDVar2 + 0x30) + lVar7);
      pcVar6 = (char *)0x8;
      uVar5 = (ulong)(uint)(iVar3 >> 0x1f) << 0x20 | uVar4 & 0xffffffff;
      __c = (int)((long)uVar5 % 8);
      if (iVar3 < 0) {
LAB_001b4bcf:
        if (-1 < iVar3) {
          io::Printer::Outdent(printer);
          pcVar6 = "}\n";
          io::Printer::Print(printer,"}\n");
          __c = extraout_EDX;
        }
        pcVar6 = FieldDescriptor::index(this_00,pcVar6,__c);
        SimpleItoa_abi_cxx11_(&local_50,(protobuf *)((ulong)pcVar6 & 0xffffffff),i_00);
        io::Printer::Print(printer,
                           "if (from._has_bits_[$index$ / 32] & (0xffu << ($index$ % 32))) {\n",
                           "index",&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        io::Printer::Indent(printer);
        field = extraout_RDX;
      }
      else {
        field = (FieldDescriptor *)(uVar9 >> 3 & 0x1fffffff);
        __c = (int)field;
        if (__c != (int)((long)uVar5 / 8)) goto LAB_001b4bcf;
      }
      FieldName_abi_cxx11_(&local_50,(cpp *)this_00,field);
      io::Printer::Print(printer,"if (from.has_$name$()) {\n","name",&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      io::Printer::Indent(printer);
      pFVar1 = FieldGeneratorMap::get(&this->field_generators_,this_00);
      (*pFVar1->_vptr_FieldGenerator[7])(pFVar1,printer);
      io::Printer::Outdent(printer);
      io::Printer::Print(printer,"}\n");
      pDVar2 = this->descriptor_;
      uVar5 = (ulong)*(uint *)(pDVar2 + 0x2c);
      uVar4 = uVar9 & 0xffffffff;
    }
    uVar9 = uVar9 + 1;
    lVar7 = lVar7 + 0x78;
  } while( true );
}

Assistant:

void MessageGenerator::
GenerateMergeFrom(io::Printer* printer) {
  if (HasDescriptorMethods(descriptor_->file())) {
    // Generate the generalized MergeFrom (aka that which takes in the Message
    // base class as a parameter).
    printer->Print(
      "void $classname$::MergeFrom(const ::google::protobuf::Message& from) {\n"
      "  GOOGLE_CHECK_NE(&from, this);\n",
      "classname", classname_);
    printer->Indent();

    // Cast the message to the proper type. If we find that the message is
    // *not* of the proper type, we can still call Merge via the reflection
    // system, as the GOOGLE_CHECK above ensured that we have the same descriptor
    // for each message.
    printer->Print(
      "const $classname$* source =\n"
      "  ::google::protobuf::internal::dynamic_cast_if_available<const $classname$*>(\n"
      "    &from);\n"
      "if (source == NULL) {\n"
      "  ::google::protobuf::internal::ReflectionOps::Merge(from, this);\n"
      "} else {\n"
      "  MergeFrom(*source);\n"
      "}\n",
      "classname", classname_);

    printer->Outdent();
    printer->Print("}\n\n");
  } else {
    // Generate CheckTypeAndMergeFrom().
    printer->Print(
      "void $classname$::CheckTypeAndMergeFrom(\n"
      "    const ::google::protobuf::MessageLite& from) {\n"
      "  MergeFrom(*::google::protobuf::down_cast<const $classname$*>(&from));\n"
      "}\n"
      "\n",
      "classname", classname_);
  }

  // Generate the class-specific MergeFrom, which avoids the GOOGLE_CHECK and cast.
  printer->Print(
    "void $classname$::MergeFrom(const $classname$& from) {\n"
    "  GOOGLE_CHECK_NE(&from, this);\n",
    "classname", classname_);
  printer->Indent();

  // Merge Repeated fields. These fields do not require a
  // check as we can simply iterate over them.
  for (int i = 0; i < descriptor_->field_count(); ++i) {
    const FieldDescriptor* field = descriptor_->field(i);

    if (field->is_repeated()) {
      field_generators_.get(field).GenerateMergingCode(printer);
    }
  }

  // Merge Optional and Required fields (after a _has_bit check).
  int last_index = -1;

  for (int i = 0; i < descriptor_->field_count(); ++i) {
    const FieldDescriptor* field = descriptor_->field(i);

    if (!field->is_repeated()) {
      // See above in GenerateClear for an explanation of this.
      if (i / 8 != last_index / 8 || last_index < 0) {
        if (last_index >= 0) {
          printer->Outdent();
          printer->Print("}\n");
        }
        printer->Print(
          "if (from._has_bits_[$index$ / 32] & (0xffu << ($index$ % 32))) {\n",
          "index", SimpleItoa(field->index()));
        printer->Indent();
      }

      last_index = i;

      printer->Print(
        "if (from.has_$name$()) {\n",
        "name", FieldName(field));
      printer->Indent();

      field_generators_.get(field).GenerateMergingCode(printer);

      printer->Outdent();
      printer->Print("}\n");
    }
  }

  if (last_index >= 0) {
    printer->Outdent();
    printer->Print("}\n");
  }

  if (descriptor_->extension_range_count() > 0) {
    printer->Print("_extensions_.MergeFrom(from._extensions_);\n");
  }

  if (HasUnknownFields(descriptor_->file())) {
    printer->Print(
      "mutable_unknown_fields()->MergeFrom(from.unknown_fields());\n");
  }

  printer->Outdent();
  printer->Print("}\n");
}